

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog.cpp
# Opt level: O0

bool __thiscall ins::Configuration::Configure(Configuration *this,int type,string *val)

{
  bool bVar1;
  LLog *this_00;
  string *val_local;
  int type_local;
  Configuration *this_local;
  
  if (type == 0) {
    bVar1 = std::operator==(val,"VERBOSE");
    if (bVar1) {
      this->log_level_ = VERBOSE;
    }
    bVar1 = std::operator==(val,"INFO");
    if (bVar1) {
      this->log_level_ = INFO;
    }
    bVar1 = std::operator==(val,"WARNING");
    if (bVar1) {
      this->log_level_ = WARNING;
    }
    bVar1 = std::operator==(val,"ERROR");
    if (bVar1) {
      this->log_level_ = ERROR;
    }
    this_local._7_1_ = true;
  }
  else if (type == 1) {
    this_00 = LLog::Instance();
    this_local._7_1_ = LLog::DupLogToFile(this_00,val);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Configuration::Configure(int type, const std::string &val) noexcept {
  switch (type) {
    case LOG_FILE:{
      return LLog::Instance().DupLogToFile(val);
    }
    case LOG_LEVEL:{
      if (val == "VERBOSE") log_level_ = VERBOSE;
      if (val == "INFO") log_level_ = INFO;
      if (val == "WARNING") log_level_ = WARNING;
      if (val == "ERROR") log_level_ = ERROR;
      return true;
    }
    default:
      return false;
  }
}